

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::CopyPropagateArrays::IsInterpolationInstruction
          (CopyPropagateArrays *this,Instruction *inst)

{
  Op OVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  IRContext *this_00;
  FeatureManager *this_01;
  uint32_t ext_inst;
  Instruction *inst_local;
  CopyPropagateArrays *this_local;
  
  OVar1 = opt::Instruction::opcode(inst);
  if (OVar1 == OpExtInst) {
    uVar2 = opt::Instruction::GetSingleWordInOperand(inst,0);
    this_00 = Pass::context((Pass *)this);
    this_01 = IRContext::get_feature_mgr(this_00);
    uVar3 = FeatureManager::GetExtInstImportId_GLSLstd450(this_01);
    if ((uVar2 == uVar3) &&
       (uVar2 = opt::Instruction::GetSingleWordInOperand(inst,1), uVar2 - 0x4c < 3)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool CopyPropagateArrays::IsInterpolationInstruction(Instruction* inst) {
  if (inst->opcode() == spv::Op::OpExtInst &&
      inst->GetSingleWordInOperand(kExtInstSetInIdx) ==
          context()->get_feature_mgr()->GetExtInstImportId_GLSLstd450()) {
    uint32_t ext_inst = inst->GetSingleWordInOperand(kExtInstOpInIdx);
    switch (ext_inst) {
      case GLSLstd450InterpolateAtCentroid:
      case GLSLstd450InterpolateAtOffset:
      case GLSLstd450InterpolateAtSample:
        return true;
    }
  }
  return false;
}